

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageLevel.cpp
# Opt level: O1

void __thiscall Imf_3_2::FlatImageLevel::eraseChannel(FlatImageLevel *this,string *name)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::FlatImageChannel_*>_>_>
               ::find(&(this->_channels)._M_t,name);
  if ((_Rb_tree_header *)__position._M_node != &(this->_channels)._M_t._M_impl.super__Rb_tree_header
     ) {
    if (*(long **)(__position._M_node + 2) != (long *)0x0) {
      (**(code **)(**(long **)(__position._M_node + 2) + 0x10))();
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_3_2::FlatImageChannel*>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_3_2::FlatImageChannel*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::FlatImageChannel*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_3_2::FlatImageChannel*>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_3_2::FlatImageChannel*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::FlatImageChannel*>>>
                        *)&this->_channels,__position);
    return;
  }
  return;
}

Assistant:

void
FlatImageLevel::eraseChannel (const string& name)
{
    ChannelMap::iterator i = _channels.find (name);

    if (i != _channels.end ())
    {
        delete i->second;
        _channels.erase (i);
    }
}